

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilnam.cpp
# Opt level: O3

int __thiscall
CVmObjFileName::getp_renameFile(CVmObjFileName *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  long lVar1;
  void *pvVar2;
  int iVar3;
  CVmNetFile *this_00;
  CVmNetFile *newname;
  uint uVar4;
  long *in_FS_OFFSET;
  err_frame_t err_cur__;
  vm_rcdesc rc;
  uint local_158 [2];
  long local_150;
  void *local_148;
  __jmp_buf_tag local_140;
  vm_rcdesc local_78;
  
  if (oargc == (uint *)0x0) {
    uVar4 = 0;
  }
  else {
    uVar4 = *oargc;
  }
  if (getp_renameFile(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_renameFile();
  }
  iVar3 = CVmObject::get_prop_check_argc(retval,oargc,&getp_renameFile::desc);
  if (iVar3 == 0) {
    CVmMetaclass::get_class_obj(metaclass_reg_);
    vm_rcdesc::init(&local_78,(EVP_PKEY_CTX *)"FileName.renameFile");
    G_err_frame::__tls_init();
    local_150 = *in_FS_OFFSET;
    G_err_frame::__tls_init();
    *in_FS_OFFSET = (long)local_158;
    local_158[0] = _setjmp(&local_140);
    if (local_158[0] == 0) {
      this_00 = CVmObjFile::get_filename_from_obj
                          (self,&local_78,0x1005,0xb,"application/octet-stream");
      newname = CVmObjFile::get_filename_arg
                          (sp_ + -1,&local_78,0x1006,0,0xb,"application/octet-stream");
      CVmNetFile::rename_to(this_00,newname);
      if (-1 < (short)local_158[0]) {
        local_158[0] = local_158[0] | 0x8000;
        CVmNetFile::abandon(this_00);
        if (newname != (CVmNetFile *)0x0) {
          CVmNetFile::abandon(newname);
        }
      }
    }
    else if (-1 < (short)local_158[0]) {
      local_158[0] = local_158[0] | 0x8000;
    }
    lVar1 = local_150;
    G_err_frame::__tls_init();
    *in_FS_OFFSET = lVar1;
    if ((local_158[0] & 0x4001) != 0) {
      G_err_frame::__tls_init();
      if ((*(byte *)*in_FS_OFFSET & 2) != 0) {
        G_err_frame::__tls_init();
        free(*(void **)(*in_FS_OFFSET + 0x10));
      }
      pvVar2 = local_148;
      G_err_frame::__tls_init();
      *(void **)(*in_FS_OFFSET + 0x10) = pvVar2;
      err_rethrow();
    }
    if ((local_158[0] & 2) != 0) {
      free(local_148);
    }
    retval->typ = VM_NIL;
    sp_ = sp_ + -(long)(int)uVar4;
  }
  return 1;
}

Assistant:

int CVmObjFileName::getp_renameFile(VMG_ vm_obj_id_t self,
                                    vm_val_t *retval, uint *oargc)
{
    /* check arguments */
    uint argc = (oargc != 0 ? *oargc : 0);
    static CVmNativeCodeDesc desc(1);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* set up our recursive callback descriptor in case netfile needs it */
    vm_rcdesc rc(vmg_ "FileName.renameFile",
                 metaclass_reg_->get_class_obj(vmg0_),
                 VMOFN_RENAMEFILE, G_stk->get(0), argc);

    CVmNetFile *oldfile = 0, *newfile = 0;
    err_try
    {
        /* get the old filename from self; use the RENAME FROM access mode */
        oldfile = CVmObjFile::get_filename_from_obj(
            vmg_ self, &rc, VMOBJFILE_ACCESS_RENAME_FROM,
            OSFTUNK, "application/octet-stream");
        
        /* get the new filename argument; use RENAME TO access mode */
        newfile = CVmObjFile::get_filename_arg(
            vmg_ G_stk->get(0), &rc, VMOBJFILE_ACCESS_RENAME_TO, FALSE,
            OSFTUNK, "application/octet-stream");

        /* rename the file */
        oldfile->rename_to(vmg_ newfile);
    }